

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O3

bool ensure_file_is_writable(char *pFilename)

{
  FILE *__stream;
  uint uVar1;
  bool bVar2;
  
  __stream = fopen64(pFilename,"wb");
  if (__stream == (FILE *)0x0) {
    uVar1 = 0xffffffff;
    do {
      usleep(250000);
      if (uVar1 == 6) {
        return false;
      }
      __stream = fopen64(pFilename,"wb");
      uVar1 = uVar1 + 1;
    } while (__stream == (FILE *)0x0);
    bVar2 = uVar1 < 7;
  }
  else {
    bVar2 = true;
  }
  fclose(__stream);
  return bVar2;
}

Assistant:

static bool ensure_file_is_writable(const char *pFilename)
{
   const int cNumRetries = 8;
   for (int i = 0; i < cNumRetries; i++)
   {
      FILE *pFile = fopen(pFilename, "wb");
      if (pFile)
      {
         fclose(pFile);
         return true;
      }
      Sleep(250);
   }
   return false;
}